

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest.cpp
# Opt level: O1

result_type * __thiscall
anon_unknown.dwarf_1218624::ByTxHashViewExtractor::operator()
          (result_type *__return_storage_ptr__,ByTxHashViewExtractor *this,Announcement *ann)

{
  long lVar1;
  undefined8 uVar2;
  Priority PVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((uint)((ulong)*(undefined8 *)&ann->field_0x30 >> 0x3d) == 1) {
    PVar3 = PriorityComputer::operator()
                      (this->m_computer,&ann->m_txhash,ann->m_peer,
                       (bool)((byte)((ulong)*(undefined8 *)&ann->field_0x30 >> 0x3b) & 1));
  }
  else {
    PVar3 = 0;
  }
  uVar2 = *(undefined8 *)&ann->field_0x30;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>).
  super__Tuple_impl<1UL,_(anonymous_namespace)::State,_unsigned_long>.
  super__Tuple_impl<2UL,_unsigned_long>.super__Head_base<2UL,_unsigned_long,_false>._M_head_impl =
       PVar3;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>).
  super__Tuple_impl<1UL,_(anonymous_namespace)::State,_unsigned_long>.
  super__Head_base<1UL,_(anonymous_namespace)::State,_false>._M_head_impl =
       (State)((ulong)uVar2 >> 0x3d);
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>).
  super__Head_base<0UL,_const_uint256_&,_false>._M_head_impl = &ann->m_txhash;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

result_type operator()(const Announcement& ann) const
    {
        const Priority prio = (ann.GetState() == State::CANDIDATE_READY) ? m_computer(ann) : 0;
        return ByTxHashView{ann.m_txhash, ann.GetState(), prio};
    }